

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::deinit(InputVariablesCannotBeModifiedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_50;
  uint n_so_id_ptr;
  uint n_so_id_ptrs;
  GLuint *so_id_ptrs [5];
  Functions *gl;
  InputVariablesCannotBeModifiedTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _n_so_id_ptr = &this->m_fs_id;
  so_id_ptrs[0] = &this->m_gs_id;
  so_id_ptrs[1] = &this->m_tc_id;
  so_id_ptrs[2] = &this->m_te_id;
  so_id_ptrs[3] = &this->m_vs_id;
  for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))
              (**(undefined4 **)(&n_so_id_ptr + (ulong)local_50 * 2));
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glDeleteShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x11f);
    **(undefined4 **)(&n_so_id_ptr + (ulong)local_50 * 2) = 0;
  }
  return;
}

Assistant:

void InputVariablesCannotBeModifiedTest::deinit()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint*		  so_id_ptrs[] = {
		&m_fs_id, &m_gs_id, &m_tc_id, &m_te_id, &m_vs_id,
	};
	const unsigned int n_so_id_ptrs = static_cast<const unsigned int>(sizeof(so_id_ptrs) / sizeof(so_id_ptrs[0]));

	for (unsigned int n_so_id_ptr = 0; n_so_id_ptr < n_so_id_ptrs; ++n_so_id_ptr)
	{
		gl.deleteShader(*so_id_ptrs[n_so_id_ptr]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");

		*so_id_ptrs[n_so_id_ptr] = 0;
	} /* for (all created shader objects) */
}